

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGlitch.c
# Opt level: O0

void Gli_ManFinalize(Gli_Man_t *p)

{
  int iVar1;
  bool bVar2;
  int local_1c;
  Gli_Obj_t *pGStack_18;
  int i;
  Gli_Obj_t *pObj;
  Gli_Man_t *p_local;
  
  if (p->iObjData != p->nObjData) {
    __assert_fail("p->iObjData == p->nObjData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaGlitch.c"
                  ,0xe1,"void Gli_ManFinalize(Gli_Man_t *)");
  }
  local_1c = 0;
  while( true ) {
    bVar2 = false;
    if (local_1c < p->nObjData) {
      pGStack_18 = Gli_ManObj(p,local_1c);
      bVar2 = pGStack_18 != (Gli_Obj_t *)0x0;
    }
    if (!bVar2) {
      return;
    }
    if ((pGStack_18->field_9).iFanin != (*(uint *)pGStack_18 >> 4 & 7)) {
      __assert_fail("pObj->iFanin == (int)pObj->nFanins",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaGlitch.c"
                    ,0xe4,"void Gli_ManFinalize(Gli_Man_t *)");
    }
    if ((pGStack_18->field_10).iFanout != *(uint *)pGStack_18 >> 7) break;
    (pGStack_18->field_9).iFanin = 0;
    (pGStack_18->field_10).iFanout = 0;
    iVar1 = Gli_ObjSize(pGStack_18);
    local_1c = iVar1 + local_1c;
  }
  __assert_fail("pObj->iFanout == (int)pObj->nFanouts",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaGlitch.c"
                ,0xe5,"void Gli_ManFinalize(Gli_Man_t *)");
}

Assistant:

void Gli_ManFinalize( Gli_Man_t * p )
{
    Gli_Obj_t * pObj;
    int i;
    assert( p->iObjData == p->nObjData );
    Gli_ManForEachObj( p, pObj, i )
    {
        assert( pObj->iFanin == (int)pObj->nFanins );
        assert( pObj->iFanout == (int)pObj->nFanouts );
        pObj->iFanin = 0;
        pObj->iFanout = 0;
    }
}